

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_signparameter.cpp
# Opt level: O2

void __thiscall
SignParameter_CopyConstructorTest_Test::~SignParameter_CopyConstructorTest_Test
          (SignParameter_CopyConstructorTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(SignParameter, CopyConstructorTest)
{
  const ByteData expect_bytedata("0123456789ABCDEF");
  // constructor
  SignParameter sign_parameter = SignParameter(expect_bytedata);
  CompareSignparameter(sign_parameter, expect_bytedata,
      SignDataType::kBinary, Pubkey(), false, SigHashType(), expect_bytedata);

  // copy constructor
  SignParameter copy;
  copy = sign_parameter;

  CompareSignparameter(sign_parameter, copy.GetData(), copy.GetDataType(),
      copy.GetRelatedPubkey(), copy.IsDerEncode(), copy.GetSigHashType(),
      expect_bytedata);
}